

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::PageEncodingStats::printTo(PageEncodingStats *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  type *val;
  type *val_00;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"PageEncodingStats(",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"page_type=",10);
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->page_type,val);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"encoding=",9);
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->encoding,val_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"count=",6);
  duckdb_apache::thrift::to_string<int>(&local_40,&this->count);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
  return;
}

Assistant:

void PageEncodingStats::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "PageEncodingStats(";
  out << "page_type=" << to_string(page_type);
  out << ", " << "encoding=" << to_string(encoding);
  out << ", " << "count=" << to_string(count);
  out << ")";
}